

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O0

void __thiscall
spvtools::opt::Instruction::ForEachInst
          (Instruction *this,function<void_(const_spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts)

{
  anon_class_8_1_54a39806 local_48;
  function<bool_(const_spvtools::opt::Instruction_*)> local_40;
  byte local_19;
  function<void_(const_spvtools::opt::Instruction_*)> *pfStack_18;
  bool run_on_debug_line_insts_local;
  function<void_(const_spvtools::opt::Instruction_*)> *f_local;
  Instruction *this_local;
  
  local_48.f = (function<void_(spvtools::opt::Instruction_*)> *)f;
  local_19 = run_on_debug_line_insts;
  pfStack_18 = f;
  f_local = (function<void_(const_spvtools::opt::Instruction_*)> *)this;
  std::function<bool(spvtools::opt::Instruction_const*)>::
  function<spvtools::opt::Instruction::ForEachInst(std::function<void(spvtools::opt::Instruction_const*)>const&,bool)const::_lambda(spvtools::opt::Instruction_const*)_1_,void>
            ((function<bool(spvtools::opt::Instruction_const*)> *)&local_40,&local_48);
  WhileEachInst(this,&local_40,(bool)(local_19 & 1));
  std::function<bool_(const_spvtools::opt::Instruction_*)>::~function(&local_40);
  return;
}

Assistant:

inline void Instruction::ForEachInst(
    const std::function<void(const Instruction*)>& f,
    bool run_on_debug_line_insts) const {
  WhileEachInst(
      [&f](const Instruction* inst) {
        f(inst);
        return true;
      },
      run_on_debug_line_insts);
}